

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURL * Qiniu_Client_initcall_withMethod(Qiniu_Client *self,char *url,char *httpMethod)

{
  CURL *pCVar1;
  
  pCVar1 = Qiniu_Client_reset(self);
  curl_easy_setopt(pCVar1,0x2734,httpMethod);
  curl_easy_setopt(pCVar1,0x40,0);
  curl_easy_setopt(pCVar1,0x51,0);
  curl_easy_setopt(pCVar1,0x2712,url);
  return pCVar1;
}

Assistant:

static CURL *Qiniu_Client_initcall_withMethod(Qiniu_Client *self, const char *url, const char *httpMethod)
{
    CURL *curl = Qiniu_Client_reset(self);
    curl_easy_setopt(curl, CURLOPT_CUSTOMREQUEST, httpMethod);
    curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0L);
    curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0L);
    curl_easy_setopt(curl, CURLOPT_URL, url);

    return curl;
}